

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_lat.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  void *__s;
  char *pcVar5;
  size_t __size;
  undefined4 uStack_28;
  int opt;
  
  if (argc != 4) {
    puts("usage: local_lat <bind-to> <msg-size> <roundtrips>");
    return 1;
  }
  pcVar5 = argv[1];
  _uStack_28 = in_RAX;
  iVar1 = atoi(argv[2]);
  iVar2 = atoi(argv[3]);
  iVar3 = nn_socket(1,0x10);
  if (iVar3 == -1) {
    pcVar5 = "s != -1";
    __line = 0x35;
  }
  else {
    _uStack_28 = CONCAT44(1,uStack_28);
    iVar4 = nn_setsockopt(iVar3,0xfffffffffffffffd,1,&opt,4);
    if (iVar4 == 0) {
      iVar4 = nn_bind(iVar3,pcVar5);
      if (iVar4 < 0) {
        pcVar5 = "rc >= 0";
        __line = 0x3a;
      }
      else {
        __size = (size_t)iVar1;
        __s = malloc(__size);
        if (__s == (void *)0x0) {
          pcVar5 = "buf";
          __line = 0x3d;
        }
        else {
          memset(__s,0x6f,__size);
          iVar2 = iVar2 + 1;
          do {
            iVar2 = iVar2 + -1;
            if (iVar2 == 0) {
              free(__s);
              iVar1 = nn_close(iVar3);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar5 = "rc == 0";
              __line = 0x4a;
              goto LAB_00101320;
            }
            iVar4 = nn_recv(iVar3,__s,__size,0);
            if (iVar4 != iVar1) {
              pcVar5 = "nbytes == (int)sz";
              __line = 0x42;
              goto LAB_00101320;
            }
            iVar4 = nn_send(iVar3,__s,__size);
          } while (iVar4 == iVar1);
          pcVar5 = "nbytes == (int)sz";
          __line = 0x44;
        }
      }
    }
    else {
      pcVar5 = "rc == 0";
      __line = 0x38;
    }
  }
LAB_00101320:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                ,__line,"int main(int, char **)");
}

Assistant:

int main (int argc, char *argv [])
{
    const char *bind_to;
    size_t sz;
    int rts;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;
    int opt;

    if (argc != 4) {
        printf ("usage: local_lat <bind-to> <msg-size> <roundtrips>\n");
        return 1;
    }
    bind_to = argv [1];
    sz = atoi (argv [2]);
    rts = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    opt = 1;
    rc = nn_setsockopt (s, NN_TCP, NN_TCP_NODELAY, &opt, sizeof (opt));
    assert (rc == 0);
    rc = nn_bind (s, bind_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    for (i = 0; i != rts; i++) {
        nbytes = nn_recv (s, buf, sz, 0);
        assert (nbytes == (int)sz);
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}